

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

Column_metadata * __thiscall
sqlite::Connection::table_column_metadata
          (Connection *this,string *table_name,string *column_name,string *db_name)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string *what;
  string *sql;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Column_metadata *in_RDI;
  int status;
  int auto_inc;
  int primary_key;
  int not_null;
  char *collation;
  char *type;
  Column_metadata *ret;
  Column_metadata *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  sqlite3 *in_stack_fffffffffffffe50;
  allocator *paVar4;
  Column_metadata *this_01;
  char *__lhs_00;
  allocator local_159;
  string local_158 [272];
  int local_48;
  int local_44;
  undefined1 local_40 [8];
  char *local_38;
  char *local_30 [6];
  
  __lhs_00 = *(char **)in_RSI;
  this_01 = in_RDI;
  uVar1 = std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::c_str();
  this_00 = (Column_metadata *)local_40;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_44;
  local_48 = sqlite3_table_column_metadata
                       (__lhs_00,uVar1,uVar2,uVar3,local_30,&local_38,local_40 + 4);
  if (local_48 == 0) {
    Column_metadata::Column_metadata(this_00);
    std::__cxx11::string::operator=((string *)this_01,local_30[0]);
    std::__cxx11::string::operator=((string *)&this_01->collation,local_38);
    this_01->not_null = local_40._4_4_ != 0;
    this_01->primary_key = local_40._0_4_ != 0;
    this_01->auto_inc = local_44 != 0;
    return in_RDI;
  }
  sqlite3_close(*(undefined8 *)in_RSI);
  what = (string *)__cxa_allocate_exception(0x48);
  std::operator+(__lhs_00,in_RSI);
  std::operator+(__lhs,(char *)this_00);
  std::operator+(__lhs,&this_00->type);
  std::operator+(__lhs,(char *)this_00);
  std::operator+(__lhs,&this_00->type);
  std::operator+(__lhs,(char *)this_00);
  sql = (string *)sqlite3_errmsg(*(undefined8 *)in_RSI);
  std::operator+(__lhs,(char *)this_00);
  paVar4 = &local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"",paVar4);
  Runtime_error::Runtime_error
            ((Runtime_error *)this_01,what,sql,(int)((ulong)paVar4 >> 0x20),
             in_stack_fffffffffffffe50);
  __cxa_throw(what,&Runtime_error::typeinfo,Runtime_error::~Runtime_error);
}

Assistant:

Connection::Column_metadata Connection::table_column_metadata(const std::string & table_name, const std::string & column_name,
        const std::string & db_name)
    {
        const char * type, * collation;
        int not_null, primary_key, auto_inc;

        int status = sqlite3_table_column_metadata(db_, db_name.c_str(), table_name.c_str(), column_name.c_str(),
            &type, &collation, &not_null, &primary_key, &auto_inc);

        if(status != SQLITE_OK)
        {
            sqlite3_close(db_);
            throw Runtime_error("Error getting column info (" +
                db_name + "." + table_name + "." + column_name + "): " +
                sqlite3_errmsg(db_), "", status, nullptr);
        }

        Column_metadata ret;
        ret.type = type;
        ret.collation = collation;
        ret.not_null = bool(not_null);
        ret.primary_key = bool(primary_key);
        ret.auto_inc = bool(auto_inc);

        return ret;
    }